

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReportUnexpectedOpcode
          (BinaryReader *this,Opcode opcode,char *where)

{
  undefined1 auVar1 [8];
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ulong local_78;
  uchar local_70 [16];
  BinaryReader *local_60;
  size_type *local_58;
  string message;
  Opcode opcode_local;
  
  local_58 = &message._M_string_length;
  message.field_2._12_4_ = opcode.enum_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unexpected opcode","");
  if (where != (char *)0x0) {
    std::__cxx11::string::push_back((string *)&local_58,' ');
    std::__cxx11::string::append((string *)&local_58,where);
  }
  std::__cxx11::string::append((string *)&local_58,":");
  Opcode::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                   (Opcode *)((long)&message.field_2 + 0xc));
  local_60 = this;
  if ((undefined1  [8])
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != local_98) {
    auVar1 = local_98;
    do {
      StringPrintf_abi_cxx11_
                ((string *)
                 &bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage," 0x%x",(ulong)*(byte *)auVar1);
      std::__cxx11::string::_M_append
                ((string *)&local_58,
                 (char *)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,local_78);
      if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != local_70) {
        operator_delete(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      auVar1 = (undefined1  [8])((long)auVar1 + 1);
    } while (auVar1 != (undefined1  [8])
                       bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    PrintError(local_60,"%s",local_58);
    if (local_98 != (undefined1  [8])0x0) {
      operator_delete((void *)local_98);
    }
    if (local_58 != &message._M_string_length) {
      operator_delete(local_58);
    }
    return (Result)Error;
  }
  __assert_fail("bytes.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader.cc"
                ,0xd8,
                "Result wabt::(anonymous namespace)::BinaryReader::ReportUnexpectedOpcode(Opcode, const char *)"
               );
}

Assistant:

Result BinaryReader::ReportUnexpectedOpcode(Opcode opcode,
                                            const char* where) {
  std::string message = "unexpected opcode";
  if (where) {
    message += ' ';
    message += where;
  }

  message += ":";

  std::vector<uint8_t> bytes = opcode.GetBytes();
  assert(bytes.size() > 0);

  for (uint8_t byte: bytes) {
    message += StringPrintf(" 0x%x", byte);
  }

  PrintError("%s", message.c_str());
  return Result::Error;
}